

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

string * __thiscall
RPCResults::ToDescriptionString_abi_cxx11_(string *__return_storage_ptr__,RPCResults *this)

{
  pointer pSVar1;
  pointer pRVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer this_00;
  long in_FS_OFFSET;
  Sections sections;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  Sections local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  this_00 = (this->m_results).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
            super__Vector_impl_data._M_start;
  pRVar2 = (this->m_results).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (this_00 != pRVar2) {
    pSVar1 = (pointer)&local_58.m_sections.super__Vector_base<Section,_std::allocator<Section>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      if (this_00->m_type != ANY) {
        if ((this_00->m_cond)._M_string_length == 0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (__return_storage_ptr__,"\nResult:\n");
        }
        else {
          std::operator+(&local_78,"\nResult (",&this_00->m_cond);
          pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_78,"):\n");
          local_58.m_sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)(pbVar3->_M_dataplus)._M_p;
          paVar4 = &pbVar3->field_2;
          if (local_58.m_sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
              super__Vector_impl_data._M_start == (pointer)paVar4) {
            local_58.m_sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)paVar4->_M_allocated_capacity;
            local_58.m_max_pad = *(size_t *)((long)&pbVar3->field_2 + 8);
            local_58.m_sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
            super__Vector_impl_data._M_start = pSVar1;
          }
          else {
            local_58.m_sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)paVar4->_M_allocated_capacity;
          }
          local_58.m_sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)pbVar3->_M_string_length;
          (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
          pbVar3->_M_string_length = 0;
          (pbVar3->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (__return_storage_ptr__,
                     (char *)local_58.m_sections.
                             super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
                             super__Vector_impl_data._M_start,
                     (size_type)
                     local_58.m_sections.super__Vector_base<Section,_std::allocator<Section>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
          if (local_58.m_sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
              super__Vector_impl_data._M_start != pSVar1) {
            operator_delete(local_58.m_sections.
                            super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (ulong)((long)&((local_58.m_sections.
                                             super__Vector_base<Section,_std::allocator<Section>_>.
                                             _M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           m_left)._M_dataplus._M_p + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
        }
        local_58.m_sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_58.m_max_pad = 0;
        local_58.m_sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_58.m_sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        ::RPCResult::ToSections(this_00,&local_58,NONE,0);
        Sections::ToString_abi_cxx11_(&local_78,&local_58);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (__return_storage_ptr__,local_78._M_dataplus._M_p,local_78._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        std::vector<Section,_std::allocator<Section>_>::~vector(&local_58.m_sections);
      }
      this_00 = this_00 + 1;
    } while (this_00 != pRVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string RPCResults::ToDescriptionString() const
{
    std::string result;
    for (const auto& r : m_results) {
        if (r.m_type == RPCResult::Type::ANY) continue; // for testing only
        if (r.m_cond.empty()) {
            result += "\nResult:\n";
        } else {
            result += "\nResult (" + r.m_cond + "):\n";
        }
        Sections sections;
        r.ToSections(sections);
        result += sections.ToString();
    }
    return result;
}